

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::ConvertToHalfPass::GenHalfInst(ConvertToHalfPass *this,Instruction *inst)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  Op local_20;
  uint32_t local_1c;
  
  local_1c = 0;
  if (inst->has_result_id_ == true) {
    local_1c = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
  }
  cVar2 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->relaxed_ids_set_)._M_h,&local_1c);
  bVar1 = IsArithmetic(this,inst);
  if ((cVar2.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) ||
     (!bVar1)) {
    local_20 = inst->opcode_;
    if (local_20 == OpPhi &&
        cVar2.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
      bVar1 = ProcessPhi(this,inst,0x20,0x10);
    }
    else if (local_20 == OpFConvert) {
      ProcessConvert(this,inst);
      bVar1 = true;
    }
    else {
      cVar3 = std::
              _Hashtable<spv::Op,_spv::Op,_std::allocator<spv::Op>,_std::__detail::_Identity,_std::equal_to<spv::Op>,_spvtools::opt::ConvertToHalfPass::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->image_ops_)._M_h,&local_20);
      if (cVar3.super__Node_iterator_base<spv::Op,_false>._M_cur == (__node_type *)0x0) {
        bVar1 = ProcessDefault(this,inst);
      }
      else {
        bVar1 = ProcessImageRef(this,inst);
      }
    }
  }
  else {
    bVar1 = GenHalfArith(this,inst);
  }
  return bVar1;
}

Assistant:

bool ConvertToHalfPass::GenHalfInst(Instruction* inst) {
  bool modified = false;
  // Remember id for later deletion of RelaxedPrecision decoration
  bool inst_relaxed = IsRelaxed(inst->result_id());
  if (IsArithmetic(inst) && inst_relaxed)
    modified = GenHalfArith(inst);
  else if (inst->opcode() == spv::Op::OpPhi && inst_relaxed)
    modified = ProcessPhi(inst, 32u, 16u);
  else if (inst->opcode() == spv::Op::OpFConvert)
    modified = ProcessConvert(inst);
  else if (image_ops_.count(inst->opcode()) != 0)
    modified = ProcessImageRef(inst);
  else
    modified = ProcessDefault(inst);
  return modified;
}